

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall GlobalSimpleStringCache::GlobalSimpleStringCache(GlobalSimpleStringCache *this)

{
  TestMemoryAllocator *pTVar1;
  SimpleStringInternalCacheNode *pSVar2;
  SimpleStringCacheAllocator *this_00;
  
  pTVar1 = defaultMallocAllocator();
  (this->cache_).allocator_ = pTVar1;
  (this->cache_).cache_ = (SimpleStringInternalCacheNode *)0x0;
  (this->cache_).nonCachedAllocations_ = (SimpleStringMemoryBlock *)0x0;
  (this->cache_).hasWarnedAboutDeallocations = false;
  pSVar2 = SimpleStringInternalCache::createInternalCacheNodes(&this->cache_);
  (this->cache_).cache_ = pSVar2;
  this_00 = (SimpleStringCacheAllocator *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                         ,0xfb);
  pTVar1 = SimpleString::getStringAllocator();
  TestMemoryAllocator::TestMemoryAllocator((TestMemoryAllocator *)this_00,"generic","alloc","free");
  (this_00->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__SimpleStringCacheAllocator_002e9098;
  this_00->cache_ = &this->cache_;
  this_00->originalAllocator_ = pTVar1;
  (this->cache_).allocator_ = pTVar1;
  this->allocator_ = this_00;
  SimpleString::setStringAllocator((TestMemoryAllocator *)this_00);
  return;
}

Assistant:

GlobalSimpleStringCache::GlobalSimpleStringCache()
{
    allocator_ = new SimpleStringCacheAllocator(cache_, SimpleString::getStringAllocator());
    SimpleString::setStringAllocator(allocator_);
}